

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckRules.cpp
# Opt level: O0

void __thiscall GrcManager::DetermineTableVersion(GrcManager *this)

{
  bool bVar1;
  GrcManager *in_RDI;
  int fxdCompilerVersionNeeded;
  int fxdRequested;
  bool fFixPassConstraints;
  int fxdVersionNeeded;
  int in_stack_fffffffffffffe2c;
  GdlRenderer *in_stack_fffffffffffffe30;
  allocator *paVar2;
  bool *in_stack_fffffffffffffe38;
  int *in_stack_fffffffffffffe40;
  int *in_stack_fffffffffffffe48;
  allocator *paVar3;
  string *in_stack_fffffffffffffe50;
  allocator *sta3;
  GrcManager *in_stack_fffffffffffffe58;
  GdlObject *in_stack_fffffffffffffe68;
  string local_190 [4];
  int in_stack_fffffffffffffe74;
  GrcErrorList *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  allocator local_149;
  string local_148 [32];
  string local_128 [39];
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [32];
  string local_b8 [39];
  allocator local_91;
  string local_90 [32];
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  int local_18;
  int local_14;
  byte local_d;
  int local_c;
  
  local_d = 1;
  local_14 = SilfTableVersion(in_RDI);
  SetCompilerVersionFor(in_RDI,local_14);
  local_18 = in_RDI->m_fxdCompilerVersion;
  bVar1 = CompatibleWithVersion
                    (in_stack_fffffffffffffe58,(int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                     in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  if (bVar1) {
    if (local_14 < local_c) {
      FixSilfTableVersion(in_RDI,local_c);
    }
  }
  else if ((((local_d & 1) == 0) || (0x30000 < local_14)) || (local_c < 0x30001)) {
    bVar1 = UserSpecifiedVersion(in_RDI);
    if (bVar1) {
      paVar2 = &local_101;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"Version ",paVar2);
      VersionString_abi_cxx11_(in_stack_fffffffffffffe9c);
      paVar2 = &local_149;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_148," of the Silf table is inadequate for your specification; version ",
                 paVar2);
      VersionString_abi_cxx11_(in_stack_fffffffffffffe9c);
      paVar2 = (allocator *)&stack0xfffffffffffffe6f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_190," will be generated instead.",paVar2);
      GrcErrorList::AddWarning
                (in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,in_stack_fffffffffffffe68,
                 (string *)in_RDI,(string *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                 in_stack_fffffffffffffe90,
                 (string *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe6f);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe90);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      std::__cxx11::string::~string(local_128);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
    }
    FixSilfTableVersion(in_RDI,local_c);
  }
  else {
    bVar1 = UserSpecifiedVersion(in_RDI);
    if (bVar1) {
      GdlRenderer::MovePassConstraintsToRules(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    }
    else {
      paVar2 = &local_39;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,"Version ",paVar2);
      VersionString_abi_cxx11_(in_stack_fffffffffffffe9c);
      sta3 = &local_91;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_90," of the Silf table is inadequate to handle pass constraints; version ",
                 sta3);
      VersionString_abi_cxx11_(in_stack_fffffffffffffe9c);
      paVar3 = &local_d9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8," will be generated.",paVar3);
      GrcErrorList::AddWarning
                (in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,in_stack_fffffffffffffe68,
                 (string *)in_RDI,(string *)paVar2,(string *)sta3,in_stack_fffffffffffffe90,
                 (string *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
      FixSilfTableVersion(in_RDI,local_c);
    }
  }
  return;
}

Assistant:

void GrcManager::DetermineTableVersion()
{
	int fxdVersionNeeded;
	bool fFixPassConstraints = true;	// remains true if the only thing that is incompatible are
										// the pass constraints
	int fxdRequested = SilfTableVersion();
	SetCompilerVersionFor(fxdRequested);
	int fxdCompilerVersionNeeded = m_fxdCompilerVersion;
	if (!CompatibleWithVersion(fxdRequested, &fxdVersionNeeded, &fxdCompilerVersionNeeded,
			&fFixPassConstraints))
	{
		if (fFixPassConstraints && fxdRequested <= 0x00030000 && fxdVersionNeeded > 0x00030000)
		{
			if (UserSpecifiedVersion())
			{
				// Converting pass constraints to rule constraints should take care of the
				// incompatibility.
				m_prndr->MovePassConstraintsToRules(fxdRequested);
			}
			else
			{
				g_errorList.AddWarning(3501, NULL,
					"Version ",
					VersionString(fxdRequested),
					" of the Silf table is inadequate to handle pass constraints; version ",
					VersionString(fxdVersionNeeded),
					" will be generated.");
				FixSilfTableVersion(fxdVersionNeeded);
			}
		}
		else 
		{
			if (UserSpecifiedVersion())
			{
				g_errorList.AddWarning(3501, NULL,
					"Version ",
					VersionString(fxdRequested),
					" of the Silf table is inadequate for your specification; version ",
					VersionString(fxdVersionNeeded),
					" will be generated instead.");
			}
			FixSilfTableVersion(fxdVersionNeeded);
		}
		
	}
	else if (fxdVersionNeeded > fxdRequested)
	{
		// Eg, 2.0 -> 2.1
		FixSilfTableVersion(fxdVersionNeeded);
	}

}